

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

oonf_layer2_neighbor_address *
oonf_layer2_neigh_add_ip(oonf_layer2_neigh *l2neigh,oonf_layer2_origin *origin,netaddr *ip)

{
  uint8_t uVar1;
  long lVar2;
  oonf_layer2_neigh *local_58;
  oonf_layer2_neighbor_address *l2addr;
  netaddr *ip_local;
  oonf_layer2_origin *origin_local;
  oonf_layer2_neigh *l2neigh_local;
  
  lVar2 = avl_find(&l2neigh->remote_neighbor_ips,ip);
  if (lVar2 == 0) {
    local_58 = (oonf_layer2_neigh *)0x0;
  }
  else {
    local_58 = (oonf_layer2_neigh *)(lVar2 + -0x60);
  }
  if (local_58 == (oonf_layer2_neigh *)0x0) {
    l2neigh_local = (oonf_layer2_neigh *)oonf_class_malloc(&_l2neigh_addr_class);
    if (l2neigh_local == (oonf_layer2_neigh *)0x0) {
      l2neigh_local = (oonf_layer2_neigh *)0x0;
    }
    else {
      *(undefined8 *)(l2neigh_local->key).addr._addr = *(undefined8 *)ip->_addr;
      *(undefined8 *)((l2neigh_local->key).addr._addr + 8) = *(undefined8 *)(ip->_addr + 8);
      uVar1 = ip->_prefix_len;
      (l2neigh_local->key).addr._type = ip->_type;
      (l2neigh_local->key).addr._prefix_len = uVar1;
      *(oonf_layer2_neigh **)((l2neigh_local->key).link_id + 5) = l2neigh;
      (l2neigh_local->remote_neighbor_ips).list_head.prev = (list_entity *)l2neigh_local;
      avl_insert(&l2neigh->remote_neighbor_ips,&(l2neigh_local->destinations).list_head.prev);
      *(oonf_layer2_neigh **)((l2neigh_local->_next_hop_v6)._addr + 10) = l2neigh_local;
      avl_insert(&l2neigh->network->remote_neighbor_ips,&l2neigh_local->network);
      *(oonf_layer2_origin **)((l2neigh_local->key).link_id + 0xd) = origin;
      oonf_class_event(&_l2neigh_addr_class,l2neigh_local,1);
    }
  }
  else {
    *(oonf_layer2_origin **)((local_58->key).link_id + 0xd) = origin;
    l2neigh_local = local_58;
  }
  return (oonf_layer2_neighbor_address *)l2neigh_local;
}

Assistant:

struct oonf_layer2_neighbor_address *
oonf_layer2_neigh_add_ip(
  struct oonf_layer2_neigh *l2neigh, const struct oonf_layer2_origin *origin, const struct netaddr *ip) {
  struct oonf_layer2_neighbor_address *l2addr;

  l2addr = oonf_layer2_neigh_get_remote_ip(l2neigh, ip);
  if (l2addr) {
    l2addr->origin = origin;
    return l2addr;
  }

  l2addr = oonf_class_malloc(&_l2neigh_addr_class);
  if (!l2addr) {
    return NULL;
  }

  /* copy data */
  memcpy(&l2addr->ip, ip, sizeof(*ip));

  /* set back reference */
  l2addr->l2neigh = l2neigh;

  /* add to tree */
  l2addr->_neigh_node.key = &l2addr->ip;
  avl_insert(&l2neigh->remote_neighbor_ips, &l2addr->_neigh_node);
  l2addr->_net_node.key = &l2addr->ip;
  avl_insert(&l2neigh->network->remote_neighbor_ips, &l2addr->_net_node);

  /* remember originator */
  l2addr->origin = origin;

  oonf_class_event(&_l2neigh_addr_class, l2addr, OONF_OBJECT_ADDED);
  return l2addr;
}